

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.h
# Opt level: O3

int secp256k1_musig_nonce_process
              (secp256k1_context *ctx,secp256k1_musig_session *session,
              secp256k1_musig_aggnonce *aggnonce,uchar *msg32,
              secp256k1_musig_keyagg_cache *keyagg_cache)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_EAX;
  long lVar3;
  bool bVar4;
  secp256k1_ge *psVar5;
  uint64_t *puVar6;
  byte bVar7;
  undefined1 auVar8 [16];
  uchar fin_nonce [32];
  uchar agg_pk32 [32];
  secp256k1_ge fin_nonce_pt;
  secp256k1_gej fin_nonce_ptj;
  uchar noncehash [32];
  secp256k1_keyagg_cache_internal cache_i;
  secp256k1_ge aggnonce_pts [2];
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  uchar local_398 [32];
  undefined1 local_378 [32];
  undefined1 local_358;
  secp256k1_fe local_350;
  int local_328;
  secp256k1_gej local_318;
  uint local_290;
  undefined8 local_28c;
  undefined8 uStack_284;
  undefined8 local_27c;
  undefined8 uStack_274;
  secp256k1_scalar local_268;
  secp256k1_scalar local_248;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  uchar local_208 [40];
  secp256k1_keyagg_cache_internal local_1e0;
  secp256k1_ge local_e8;
  secp256k1_ge local_90;
  
  bVar7 = 0;
  if (session == (secp256k1_musig_session *)0x0) {
    secp256k1_musig_nonce_process_cold_4();
  }
  else if (aggnonce == (secp256k1_musig_aggnonce *)0x0) {
    secp256k1_musig_nonce_process_cold_3();
  }
  else if (msg32 == (uchar *)0x0) {
    secp256k1_musig_nonce_process_cold_2();
  }
  else {
    if (keyagg_cache != (secp256k1_musig_keyagg_cache *)0x0) {
      iVar2 = secp256k1_keyagg_cache_load(ctx,&local_1e0,keyagg_cache);
      if (iVar2 == 0) {
        return 0;
      }
      secp256k1_fe_impl_get_b32(local_398,(secp256k1_fe *)&local_1e0);
      iVar2 = secp256k1_musig_aggnonce_load(ctx,&local_e8,aggnonce);
      if (iVar2 == 0) {
        return 0;
      }
      local_318.x.n[0] = 0x6bf7e532c7d5a45;
      local_318.x.n[1] = 0x971254c089be68a6;
      local_318.x.n[2] = 0x72846dcd60ac12d2;
      local_318.x.n[3] = 0xde7a25006c81212f;
      local_318.z.n[2] = 0x40;
      psVar5 = &local_e8;
      bVar1 = true;
      do {
        bVar4 = bVar1;
        if (psVar5->infinity == 0) {
          secp256k1_eckey_pubkey_serialize(psVar5,local_378,(size_t *)&local_290,1);
        }
        else {
          local_378._16_16_ = (undefined1  [16])0x0;
          local_378._0_16_ = (undefined1  [16])0x0;
          local_358 = 0;
        }
        secp256k1_sha256_write((secp256k1_sha256 *)&local_318,local_378,0x21);
        psVar5 = &local_90;
        bVar1 = false;
      } while (bVar4);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_318,local_398,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)&local_318,msg32,0x20);
      secp256k1_sha256_finalize((secp256k1_sha256 *)&local_318,local_208);
      secp256k1_scalar_set_b32(&local_268,local_208,(int *)0x0);
      secp256k1_effective_nonce(&local_318,&local_e8,&local_268);
      secp256k1_ge_set_gej((secp256k1_ge *)local_378,&local_318);
      if (local_328 != 0) {
        psVar5 = &secp256k1_ge_const_g;
        puVar6 = (uint64_t *)local_378;
        for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar6 = (psVar5->x).n[0];
          psVar5 = (secp256k1_ge *)((long)psVar5 + ((ulong)bVar7 * -2 + 1) * 8);
          puVar6 = puVar6 + (ulong)bVar7 * -2 + 1;
        }
      }
      secp256k1_fe_impl_normalize_var((secp256k1_fe *)local_378);
      secp256k1_fe_impl_get_b32((uchar *)&local_3b8,(secp256k1_fe *)local_378);
      secp256k1_fe_impl_normalize_var(&local_350);
      local_290 = (uint)local_350.n[0] & 1;
      secp256k1_schnorrsig_challenge(&local_248,(uchar *)&local_3b8,msg32,0x20,local_398);
      local_218 = (undefined1  [16])0x0;
      local_228 = (undefined1  [16])0x0;
      auVar8._0_4_ = -(uint)((int)local_1e0.tweak.d[2] == 0 && (int)local_1e0.tweak.d[0] == 0);
      auVar8._4_4_ = -(uint)(local_1e0.tweak.d[2]._4_4_ == 0 && local_1e0.tweak.d[0]._4_4_ == 0);
      auVar8._8_4_ = -(uint)((int)local_1e0.tweak.d[3] == 0 && (int)local_1e0.tweak.d[1] == 0);
      auVar8._12_4_ = -(uint)(local_1e0.tweak.d[3]._4_4_ == 0 && local_1e0.tweak.d[1]._4_4_ == 0);
      iVar2 = movmskps(extraout_EAX,auVar8);
      if (iVar2 != 0xf) {
        secp256k1_scalar_mul((secp256k1_scalar *)&local_318,&local_248,&local_1e0.tweak);
        if (((byte)local_1e0.pk.y.n[0] & 1) != 0) {
          secp256k1_scalar_negate((secp256k1_scalar *)&local_318,(secp256k1_scalar *)&local_318);
        }
        local_218._8_8_ = local_318.x.n[3];
        local_218._0_8_ = local_318.x.n[2];
        local_228._8_8_ = local_318.x.n[1];
        local_228._0_8_ = local_318.x.n[0];
      }
      local_27c = local_3a8;
      uStack_274 = uStack_3a0;
      local_28c = local_3b8;
      uStack_284 = uStack_3b0;
      session->data[0] = 0x9d;
      session->data[1] = 0xed;
      session->data[2] = 0xe9;
      session->data[3] = '\x17';
      session->data[4] = (uchar)local_290;
      *(undefined8 *)(session->data + 5) = local_3b8;
      *(undefined8 *)(session->data + 0xd) = uStack_3b0;
      *(undefined8 *)(session->data + 0x15) = local_3a8;
      *(undefined8 *)(session->data + 0x1d) = uStack_3a0;
      secp256k1_scalar_get_b32(session->data + 0x25,&local_268);
      secp256k1_scalar_get_b32(session->data + 0x45,&local_248);
      secp256k1_scalar_get_b32(session->data + 0x65,(secp256k1_scalar *)local_228);
      return 1;
    }
    secp256k1_musig_nonce_process_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_musig_nonce_process(const secp256k1_context* ctx, secp256k1_musig_session *session, const secp256k1_musig_aggnonce  *aggnonce, const unsigned char *msg32, const secp256k1_musig_keyagg_cache *keyagg_cache) {
    secp256k1_keyagg_cache_internal cache_i;
    secp256k1_ge aggnonce_pts[2];
    unsigned char fin_nonce[32];
    secp256k1_musig_session_internal session_i;
    unsigned char agg_pk32[32];

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(session != NULL);
    ARG_CHECK(aggnonce != NULL);
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(keyagg_cache != NULL);

    if (!secp256k1_keyagg_cache_load(ctx, &cache_i, keyagg_cache)) {
        return 0;
    }
    secp256k1_fe_get_b32(agg_pk32, &cache_i.pk.x);

    if (!secp256k1_musig_aggnonce_load(ctx, aggnonce_pts, aggnonce)) {
        return 0;
    }

    secp256k1_musig_nonce_process_internal(&session_i.fin_nonce_parity, fin_nonce, &session_i.noncecoef, aggnonce_pts, agg_pk32, msg32);
    secp256k1_schnorrsig_challenge(&session_i.challenge, fin_nonce, msg32, 32, agg_pk32);

    /* If there is a tweak then set `challenge` times `tweak` to the `s`-part.*/
    secp256k1_scalar_set_int(&session_i.s_part, 0);
    if (!secp256k1_scalar_is_zero(&cache_i.tweak)) {
        secp256k1_scalar e_tmp;
        secp256k1_scalar_mul(&e_tmp, &session_i.challenge, &cache_i.tweak);
        if (secp256k1_fe_is_odd(&cache_i.pk.y)) {
            secp256k1_scalar_negate(&e_tmp, &e_tmp);
        }
        session_i.s_part = e_tmp;
    }
    memcpy(session_i.fin_nonce, fin_nonce, sizeof(session_i.fin_nonce));
    secp256k1_musig_session_save(session, &session_i);
    return 1;
}